

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O1

RangeToken * __thiscall
xercesc_4_0::RangeTokenMap::getRange(RangeTokenMap *this,XMLCh *keyword,bool complement)

{
  ushort uVar1;
  RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher> *pRVar2;
  RefHashTableOf<xercesc_4_0::RangeFactory,_xercesc_4_0::StringHasher> *pRVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  RangeToken *pRVar7;
  XMLCh *pXVar8;
  ushort *puVar9;
  XMLCh XVar10;
  RangeFactory *pRVar11;
  RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *pRVar12;
  RangeTokenElemMap *pRVar13;
  RefHashTableBucketElem<xercesc_4_0::RangeFactory> *pRVar14;
  XMLMutexLock lockInit;
  XMLMutexLock local_38;
  ushort *key1;
  
  pRVar2 = this->fTokenRegistry;
  if ((keyword == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*keyword, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar10 = keyword[1];
    if (XVar10 != L'\0') {
      pXVar8 = keyword + 2;
      do {
        uVar6 = (ulong)(ushort)XVar10 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar10 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar10 != L'\0');
    }
    uVar6 = uVar6 % pRVar2->fHashModulus;
  }
  pRVar12 = pRVar2->fBucketList[uVar6];
  if (pRVar12 == (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    return (RangeToken *)0x0;
  }
  do {
    bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,keyword,pRVar12->fKey);
    if (bVar4) goto LAB_00242008;
    pRVar12 = pRVar12->fNext;
  } while (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0);
  if (!bVar4) {
    return (RangeToken *)0x0;
  }
LAB_00242008:
  pRVar2 = this->fTokenRegistry;
  if ((keyword == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*keyword, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    XVar10 = keyword[1];
    if (XVar10 != L'\0') {
      pXVar8 = keyword + 2;
      do {
        uVar6 = (ulong)(ushort)XVar10 + (uVar6 >> 0x18) + uVar6 * 0x26;
        XVar10 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar10 != L'\0');
    }
    uVar6 = uVar6 % pRVar2->fHashModulus;
  }
  pRVar12 = pRVar2->fBucketList[uVar6];
  if (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,keyword,pRVar12->fKey);
      if (bVar4) goto LAB_00242093;
      pRVar12 = pRVar12->fNext;
    } while (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0);
  }
  pRVar12 = (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0;
LAB_00242093:
  if (pRVar12 == (RefHashTableBucketElem<xercesc_4_0::RangeTokenElemMap> *)0x0) {
    pRVar13 = (RangeTokenElemMap *)0x0;
  }
  else {
    pRVar13 = pRVar12->fData;
  }
  if ((&pRVar13->fRange)[complement] != (RangeToken *)0x0) {
    return (&pRVar13->fRange)[complement];
  }
  XMLMutexLock::XMLMutexLock(&local_38,&this->fMutex);
  pRVar7 = (&pRVar13->fRange)[complement];
  if (pRVar7 != (RangeToken *)0x0) goto LAB_002421ca;
  iVar5 = (*(this->fCategories->super_XSerializable)._vptr_XSerializable[10])
                    (this->fCategories,(ulong)pRVar13->fCategoryId);
  key1 = (ushort *)CONCAT44(extraout_var,iVar5);
  pRVar3 = this->fRangeMap;
  if ((key1 == (ushort *)0x0) || (uVar6 = (ulong)*key1, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    uVar1 = key1[1];
    if (uVar1 != 0) {
      puVar9 = key1 + 2;
      do {
        uVar6 = (ulong)uVar1 + (uVar6 >> 0x18) + uVar6 * 0x26;
        uVar1 = *puVar9;
        puVar9 = puVar9 + 1;
      } while (uVar1 != 0);
    }
    uVar6 = uVar6 % pRVar3->fHashModulus;
  }
  pRVar14 = pRVar3->fBucketList[uVar6];
  if (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0) {
    do {
      bVar4 = StringHasher::equals((StringHasher *)&pRVar3->field_0x30,key1,pRVar14->fKey);
      if (bVar4) goto LAB_00242171;
      pRVar14 = pRVar14->fNext;
    } while (pRVar14 != (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0);
  }
  pRVar14 = (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0;
LAB_00242171:
  if (pRVar14 == (RefHashTableBucketElem<xercesc_4_0::RangeFactory> *)0x0) {
    pRVar11 = (RangeFactory *)0x0;
  }
  else {
    pRVar11 = pRVar14->fData;
  }
  if (pRVar11 != (RangeFactory *)0x0) {
    (*pRVar11->_vptr_RangeFactory[3])(pRVar11,this);
    pRVar7 = (&pRVar13->fRange)[complement];
    if (!complement || pRVar7 != (RangeToken *)0x0) goto LAB_002421ca;
    if (pRVar13->fRange != (RangeToken *)0x0) {
      pRVar7 = RangeToken::complementRanges
                         (pRVar13->fRange,this->fTokenFactory,this->fTokenRegistry->fMemoryManager);
      pRVar13->fNRange = pRVar7;
      goto LAB_002421ca;
    }
  }
  pRVar7 = (RangeToken *)0x0;
LAB_002421ca:
  XMLMutexLock::~XMLMutexLock(&local_38);
  return pRVar7;
}

Assistant:

RangeToken* RangeTokenMap::getRange(const XMLCh* const keyword,
                                    const bool complement) {

    if (!fTokenRegistry->containsKey(keyword))
        return 0;

    RangeTokenElemMap* elemMap = fTokenRegistry->get(keyword);
    RangeToken* rangeTok = elemMap->getRangeToken(complement);

    if (!rangeTok)
    {
        XMLMutexLock lockInit(&fMutex);

        // make sure that it was not created while we were locked
        rangeTok = elemMap->getRangeToken(complement);

        if (!rangeTok)
        {
            unsigned int categId = elemMap->getCategoryId();
            const XMLCh* categName = fCategories->getValueForId(categId);
            RangeFactory* rangeFactory = fRangeMap->get(categName);

            if (rangeFactory)
            {
                rangeFactory->buildRanges(this);
                rangeTok = elemMap->getRangeToken(complement);

                // see if we are complementing an existing range
                if (!rangeTok && complement)
                {
                    rangeTok = elemMap->getRangeToken();
                    if (rangeTok)
                    {
                        rangeTok = RangeToken::complementRanges(rangeTok, fTokenFactory, fTokenRegistry->getMemoryManager());
                        elemMap->setRangeToken(rangeTok , complement);
                    }
                }
            }
        }
    }

    return rangeTok;
}